

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_98ca::BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test::TestBody
          (BuildSystemCAPI_CustomToolWithDiscoveredDependencies_Test *this)

{
  char cVar1;
  llb_buildsystem_delegate_t delegate;
  llb_buildsystem_invocation_t invocation;
  bool bVar2;
  long *plVar3;
  long *plVar4;
  long *plVar5;
  ostream *poVar6;
  llb_buildsystem_t *system_p;
  long lVar7;
  _func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
  *p_Var8;
  long *plVar9;
  long lVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  char *pcVar14;
  byte bVar15;
  string outputFilePath;
  string depInfoFilePath;
  string directInputFilePath;
  string indirectInputFilePath;
  string tmpDirPath;
  string outputContentsSecondBuild;
  string buildFilePath;
  llb_data_t key;
  string outputContentsFirstBuild;
  ostringstream buildFileContents;
  string in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffffa30 [112];
  long lVar16;
  long lVar17;
  long in_stack_fffffffffffffae8;
  long lVar18;
  long lVar19;
  long in_stack_fffffffffffffb08;
  _func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
  *p_Var20;
  long lVar21;
  long lVar22;
  long in_stack_fffffffffffffb28;
  long *plVar23;
  long *local_4b0;
  long local_4a8;
  long local_4a0 [2];
  Message local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_488;
  AssertHelper local_480;
  undefined1 local_478 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_470;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_468;
  long *local_458;
  undefined8 uStack_450;
  undefined1 uStack_448;
  undefined7 local_447;
  undefined1 uStack_440;
  undefined7 uStack_43f;
  undefined1 uStack_438;
  undefined1 local_437;
  undefined6 local_436;
  undefined2 uStack_430;
  undefined6 uStack_42e;
  long *local_428;
  long local_420;
  long local_418 [2];
  llb_data_t local_408;
  AssertHelper local_3f8;
  string *local_3f0 [2];
  undefined1 local_3e0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3c0;
  string *local_3b0 [2];
  undefined1 local_3a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  undefined1 local_380 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_370;
  undefined1 local_360 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_350;
  long local_340 [2];
  long *local_330 [2];
  long local_320 [2];
  long *local_310 [2];
  long local_300 [2];
  long *local_2f0;
  long local_2e0 [2];
  long *local_2d0 [2];
  long local_2c0 [2];
  long *local_2b0 [2];
  long local_2a0 [2];
  long *local_290 [2];
  long local_280 [12];
  ios_base local_220 [264];
  undefined8 local_118;
  undefined8 uStack_110;
  code *local_108;
  undefined8 local_100;
  code *local_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  code *local_e0;
  code *local_d8;
  code *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  code *local_b0;
  code *local_a8;
  code *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  code *local_68;
  code *local_60;
  code *local_58;
  code *local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  bVar15 = 0;
  llbuild::basic::sys::makeTmpDir_abi_cxx11_();
  if (local_4a8 == 0) {
    lVar11 = 0;
  }
  else {
    lVar7 = 0;
    do {
      if (*(char *)((long)local_4b0 + lVar7) == '\\') {
        *(undefined1 *)((long)local_4b0 + lVar7) = 0x2f;
      }
      lVar7 = lVar7 + 1;
      lVar11 = local_4a8;
    } while (local_4a8 != lVar7);
  }
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char*>((string *)local_290,local_4b0,lVar11 + (long)local_4b0);
  std::__cxx11::string::append((char *)local_290);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_290);
  plVar23 = (long *)&stack0xfffffffffffffb40;
  plVar4 = plVar3 + 2;
  if ((long *)*plVar3 == plVar4) {
    lVar11 = *plVar4;
  }
  else {
    lVar11 = *plVar4;
    plVar23 = (long *)*plVar3;
  }
  lVar7 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  local_370._M_allocated_capacity = (size_type)(string *)local_360;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_380 + 0x10),plVar23,(undefined1 *)((long)plVar23 + lVar7));
  local_2b0[0] = local_2a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b0,"1","");
  writeFileContents(in_stack_fffffffffffff9b8,(string *)local_370._M_allocated_capacity);
  if (local_2b0[0] != local_2a0) {
    operator_delete(local_2b0[0],local_2a0[0] + 1);
  }
  if ((string *)local_370._M_allocated_capacity != (string *)local_360) {
    operator_delete((void *)local_370._M_allocated_capacity,(ulong)(local_360._0_8_ + 1));
  }
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_290,local_4b0,local_4a8 + (long)local_4b0);
  std::__cxx11::string::append((char *)local_290);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_290);
  p_Var20 = (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
             *)&stack0xfffffffffffffb20;
  p_Var8 = (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
            *)(plVar3 + 2);
  if ((_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
       *)*plVar3 == p_Var8) {
    lVar22 = *(long *)p_Var8;
    in_stack_fffffffffffffb28 = plVar3[3];
  }
  else {
    lVar22 = *(long *)p_Var8;
    p_Var20 = (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
               *)*plVar3;
  }
  lVar21 = plVar3[1];
  *plVar3 = (long)p_Var8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  local_390._M_allocated_capacity = (size_type)(string *)local_380;
  std::__cxx11::string::_M_construct<char*>((string *)(local_3a0 + 0x10),p_Var20,p_Var20 + lVar21);
  local_2d0[0] = local_2c0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_2d0,plVar23,(undefined1 *)((long)plVar23 + lVar7));
  writeFileContents(in_stack_fffffffffffff9b8,(string *)local_390._M_allocated_capacity);
  if (local_2d0[0] != local_2c0) {
    operator_delete(local_2d0[0],local_2c0[0] + 1);
  }
  if ((string *)local_390._M_allocated_capacity != (string *)local_380) {
    operator_delete((void *)local_390._M_allocated_capacity,(ulong)(local_380._0_8_ + 1));
  }
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_290,local_4b0,local_4a8 + (long)local_4b0);
  std::__cxx11::string::append((char *)local_290);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_290);
  plVar3 = (long *)&stack0xfffffffffffffae0;
  plVar5 = plVar4 + 2;
  if ((long *)*plVar4 == plVar5) {
    lVar17 = *plVar5;
    in_stack_fffffffffffffae8 = plVar4[3];
  }
  else {
    lVar17 = *plVar5;
    plVar3 = (long *)*plVar4;
  }
  lVar16 = plVar4[1];
  *plVar4 = (long)plVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  local_290[0] = local_280;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_290,local_4b0,local_4a8 + (long)local_4b0);
  std::__cxx11::string::append((char *)local_290);
  plVar5 = (long *)std::__cxx11::string::append((char *)local_290);
  plVar4 = (long *)&stack0xfffffffffffffb00;
  plVar9 = plVar5 + 2;
  if ((long *)*plVar5 == plVar9) {
    lVar19 = *plVar9;
    in_stack_fffffffffffffb08 = plVar5[3];
  }
  else {
    lVar19 = *plVar9;
    plVar4 = (long *)*plVar5;
  }
  lVar18 = plVar5[1];
  *plVar5 = (long)plVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if (local_290[0] != local_280) {
    operator_delete(local_290[0],local_280[0] + 1);
  }
  local_428 = local_418;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_428,local_4b0,local_4a8 + (long)local_4b0);
  std::__cxx11::string::append((char *)&local_428);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_290);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"client:",7);
  cVar1 = (char)(ostringstream *)local_290;
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"  name: basic",0xd);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"targets:",8);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"  \"\": [\"<all>\"]",0xf)
  ;
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"nodes:",6);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"  \"",3);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_290,(char *)plVar3,lVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\": {}",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"commands:",9);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_290,"  \"copy-indirectly|",0x13);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_290,(char *)p_Var20,lVar21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)plVar3,lVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"|",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)plVar4,lVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\":",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_290,"    tool: custom-depinfo-tester-tool",0x24);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"    inputs: [\"",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_290,(char *)p_Var20,lVar21);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"]",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"    outputs: [\"",0xf);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_290,(char *)plVar3,lVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\", \"",4);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)plVar4,lVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"]",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"    deps: \"",0xb);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_290,(char *)plVar4,lVar18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"  \"<all>\":",10);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"    tool: phony",0xf);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_290,"    inputs: [\"",0xe);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_290,(char *)plVar3,lVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\"]",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_290,"    outputs: [\"<all>\"]",0x16);
  std::ios::widen((char)local_290[0][-3] + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  local_3b0[0] = (string *)local_3a0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3b0,local_428,local_420 + (long)local_428);
  std::__cxx11::stringbuf::str();
  writeFileContents(in_stack_fffffffffffff9b8,local_3b0[0]);
  if (local_2f0 != local_2e0) {
    operator_delete(local_2f0,local_2e0[0] + 1);
  }
  if (local_3b0[0] != (string *)local_3a0) {
    operator_delete(local_3b0[0],(ulong)(local_3a0._0_8_ + 1));
  }
  uStack_440 = 0;
  uStack_43f = 0;
  uStack_438 = 0;
  uStack_450 = 0;
  uStack_448 = 0;
  local_447 = 0;
  local_436 = 0;
  uStack_430 = 0;
  uStack_42e = 0;
  local_f0 = 0;
  uStack_e8 = 0;
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  local_118 = 0;
  uStack_110 = 0;
  local_108 = fs_get_file_contents;
  local_100 = 0;
  local_f8 = fs_get_file_info;
  local_e0 = lookup_tool;
  local_d8 = handle_diagnostic;
  local_d0 = had_command_failure;
  local_b0 = command_started;
  local_a8 = command_finished;
  local_a0 = command_found_discovered_dependency;
  local_68 = command_process_started;
  local_60 = command_process_had_error;
  local_58 = command_process_had_output;
  local_50 = command_process_finished;
  local_458 = local_428;
  local_437 = 1;
  puVar12 = &local_118;
  puVar13 = (undefined8 *)&stack0xfffffffffffff9b8;
  for (lVar10 = 0x1d; lVar10 != 0; lVar10 = lVar10 + -1) {
    *puVar13 = *puVar12;
    puVar12 = puVar12 + (ulong)bVar15 * -2 + 1;
    puVar13 = puVar13 + (ulong)bVar15 * -2 + 1;
  }
  delegate.command_had_error._1_7_ = local_447;
  delegate.command_had_error._0_1_ = uStack_448;
  delegate.command_had_note._1_7_ = uStack_43f;
  delegate.command_had_note._0_1_ = uStack_440;
  delegate.command_had_warning._1_1_ = local_437;
  delegate.command_had_warning._0_1_ = uStack_438;
  delegate.command_had_warning._2_6_ = local_436;
  delegate.command_cannot_build_output_due_to_missing_inputs._2_6_ = uStack_42e;
  delegate.command_cannot_build_output_due_to_missing_inputs._0_2_ = uStack_430;
  delegate.command_finished =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)
       local_458;
  delegate.context = (void *)in_stack_fffffffffffffa30._0_8_;
  delegate.fs_create_directory = (_func_bool_void_ptr_char_ptr *)in_stack_fffffffffffffa30._8_8_;
  delegate.fs_get_file_contents =
       (_func_bool_void_ptr_char_ptr_llb_data_t_ptr *)in_stack_fffffffffffffa30._16_8_;
  delegate.fs_remove = (_func_bool_void_ptr_char_ptr *)in_stack_fffffffffffffa30._24_8_;
  delegate.fs_get_file_info =
       (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)in_stack_fffffffffffffa30._32_8_;
  delegate.fs_get_link_info =
       (_func_void_void_ptr_char_ptr_llb_fs_file_info_t_ptr *)in_stack_fffffffffffffa30._40_8_;
  delegate.fs_create_symlink =
       (_func_bool_void_ptr_char_ptr_char_ptr *)in_stack_fffffffffffffa30._48_8_;
  delegate.lookup_tool =
       (_func_llb_buildsystem_tool_t_ptr_void_ptr_llb_data_t_ptr *)in_stack_fffffffffffffa30._56_8_;
  delegate.handle_diagnostic =
       (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)
       in_stack_fffffffffffffa30._64_8_;
  delegate.had_command_failure = (_func_void_void_ptr *)in_stack_fffffffffffffa30._72_8_;
  delegate.command_status_changed =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_status_kind_t *)
       in_stack_fffffffffffffa30._80_8_;
  delegate.command_preparing =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)in_stack_fffffffffffffa30._88_8_;
  delegate.should_command_start =
       (_func_bool_void_ptr_llb_buildsystem_command_t_ptr *)in_stack_fffffffffffffa30._96_8_;
  delegate.command_started =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr *)in_stack_fffffffffffffa30._104_8_;
  delegate.command_found_discovered_dependency =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
        *)uStack_450;
  delegate.choose_command_from_multiple_producers =
       (_func_llb_buildsystem_command_t_ptr_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t
        *)plVar3;
  delegate.cannot_build_node_due_to_multiple_producers =
       (_func_void_void_ptr_llb_build_key_t_ptr_ptr_llb_buildsystem_command_t_ptr_ptr_uint64_t *)
       lVar16;
  delegate.command_process_started =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr *)lVar17;
  delegate.command_process_had_error =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
        *)in_stack_fffffffffffffae8;
  delegate.command_process_had_output =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_data_t_ptr
        *)plVar4;
  delegate.command_process_finished =
       (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_process_t_ptr_llb_buildsystem_command_extended_result_t_ptr
        *)lVar18;
  delegate.determined_rule_needs_to_run =
       (_func_void_void_ptr_llb_build_key_t_ptr_llb_rule_run_reason_t_llb_build_key_t_ptr *)lVar19;
  delegate.cycle_detected =
       (_func_void_void_ptr_llb_build_key_t_ptr_ptr_uint64_t *)in_stack_fffffffffffffb08;
  delegate.should_resolve_cycle = p_Var20;
  invocation.dbPath = (char *)lVar22;
  invocation.buildFilePath = (char *)lVar21;
  invocation.traceFilePath = (char *)in_stack_fffffffffffffb28;
  invocation.environment = (char **)plVar23;
  invocation.showVerboseStatus = (bool)(char)lVar7;
  invocation.useSerialBuild = (bool)(char)((ulong)lVar7 >> 8);
  invocation._34_2_ = (short)((ulong)lVar7 >> 0x10);
  invocation.schedulerAlgorithm = (int)((ulong)lVar7 >> 0x20);
  invocation.schedulerLanes = (int)lVar11;
  invocation.qos = (int)((ulong)lVar11 >> 0x20);
  system_p = llb_buildsystem_create(delegate,invocation);
  llb_buildsystem_initialize(system_p);
  local_408.length = 0;
  local_408.data = (uint8_t *)0x0;
  puts("initial build:");
  bVar2 = llb_buildsystem_build(system_p,&local_408);
  if (!bVar2) {
    puts("build had command failures");
  }
  local_310[0] = local_300;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_310,plVar3,(char *)((long)plVar3 + lVar16));
  readFileContents((string *)(local_3e0 + 0x10),in_stack_fffffffffffff9b8);
  if (local_310[0] != local_300) {
    operator_delete(local_310[0],local_300[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)local_478,"outputContentsFirstBuild","\"1\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3e0 + 0x10)
             ,(char (*) [2])0x1ed4f4);
  if (local_478[0] == (internal)0x0) {
    testing::Message::Message(&local_490);
    if (local_470 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (local_470->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_480,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/CAPI/BuildSystem-C-API.cpp"
               ,0x17f,pcVar14);
    testing::internal::AssertHelper::operator=(&local_480,&local_490);
    testing::internal::AssertHelper::~AssertHelper(&local_480);
    if ((long *)CONCAT71(local_490.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_490.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_490.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_490.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (local_470 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_470,local_470);
  }
  llbuild::basic::sys::sleep(1);
  local_3f0[0] = (string *)local_3e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3f0,plVar23,(undefined1 *)((long)plVar23 + lVar7));
  local_330[0] = local_320;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_330,"2","");
  writeFileContents(in_stack_fffffffffffff9b8,local_3f0[0]);
  if (local_330[0] != local_320) {
    operator_delete(local_330[0],local_320[0] + 1);
  }
  if (local_3f0[0] != (string *)local_3e0) {
    operator_delete(local_3f0[0],(ulong)(local_3e0._0_8_ + 1));
  }
  puts("second build:");
  bVar2 = llb_buildsystem_build(system_p,&local_408);
  if (!bVar2) {
    puts("build had command failures");
  }
  local_350._M_allocated_capacity = (size_type)local_340;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_360 + 0x10),plVar3,(char *)((long)plVar3 + lVar16));
  readFileContents((string *)local_478,in_stack_fffffffffffff9b8);
  if ((long *)local_350._M_allocated_capacity != local_340) {
    operator_delete((void *)local_350._M_allocated_capacity,local_340[0] + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)&local_490,"outputContentsSecondBuild","\"2\"",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_478,
             (char (*) [2])0x1f883c);
  if (local_490.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_480);
    if (local_488 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = "";
    }
    else {
      pcVar14 = (local_488->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/unittests/CAPI/BuildSystem-C-API.cpp"
               ,0x191,pcVar14);
    testing::internal::AssertHelper::operator=(&local_3f8,(Message *)&local_480);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    if (local_480.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_480.data_ + 8))();
    }
  }
  if (local_488 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_488,local_488);
  }
  llb_buildsystem_destroy(system_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT71(local_478._1_7_,local_478[0]) != &local_468) {
    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71(local_478._1_7_,local_478[0]),local_468._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._16_8_ != &local_3c0) {
    operator_delete((void *)local_3e0._16_8_,local_3c0._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_290);
  std::ios_base::~ios_base(local_220);
  if (local_428 != local_418) {
    operator_delete(local_428,local_418[0] + 1);
  }
  if (plVar4 != (long *)&stack0xfffffffffffffb00) {
    operator_delete(plVar4,lVar19 + 1);
  }
  if (plVar3 != (long *)&stack0xfffffffffffffae0) {
    operator_delete(plVar3,lVar17 + 1);
  }
  if (p_Var20 !=
      (_func_uint8_t_void_ptr_llb_build_key_t_ptr_ptr_uint64_t_llb_build_key_t_ptr_llb_cycle_action_t
       *)&stack0xfffffffffffffb20) {
    operator_delete(p_Var20,lVar22 + 1);
  }
  if (plVar23 != (long *)&stack0xfffffffffffffb40) {
    operator_delete(plVar23,lVar11 + 1);
  }
  if (local_4b0 != local_4a0) {
    operator_delete(local_4b0,local_4a0[0] + 1);
  }
  return;
}

Assistant:

TEST(BuildSystemCAPI, CustomToolWithDiscoveredDependencies) {
  std::string tmpDirPath = llbuild::basic::sys::makeTmpDir();
  for (auto& c : tmpDirPath) {
    if (c == '\\') {
      c = '/';
    }
  }
  // We write out an indirectly referenced file containing data to be copied to
  // the output file.
  std::string indirectInputFilePath = tmpDirPath + "/" + "indirect-input-file";
  writeFileContents(indirectInputFilePath, "1");
  
  // Write out a directly referenced file containing the path of the indirectly
  // referenced file.
  std::string directInputFilePath = tmpDirPath + "/" + "direct-input-file";
  writeFileContents(directInputFilePath, indirectInputFilePath);
  
  // The output file will be written by the tool.
  std::string outputFilePath = tmpDirPath + "/" + "output-file";
  
  // The dependency info file will also be written by the tool.
  std::string depInfoFilePath = tmpDirPath + "/" + "dep-info-file";
  
  // Write out a build manifest containing node definitions and a build rule to
  // use a custom rule to copy the contents of the indirect input file to the
  // output file, via the path in the direct input file.
  std::string buildFilePath = tmpDirPath + "/llbuild";  
  std::ostringstream buildFileContents;
  buildFileContents << "client:" << std::endl;
  buildFileContents << "  name: basic" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "targets:" << std::endl;
  buildFileContents << "  \"\": [\"<all>\"]" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "nodes:" << std::endl;
  buildFileContents << "  \"" << outputFilePath << "\": {}" << std::endl;
  buildFileContents << std::endl;
  buildFileContents << "commands:" << std::endl;
  buildFileContents << "  \"copy-indirectly|" << directInputFilePath << "|" << outputFilePath << "|" << depInfoFilePath << "\":" << std::endl;
  buildFileContents << "    tool: custom-depinfo-tester-tool" << std::endl;
  buildFileContents << "    inputs: [\"" << directInputFilePath << "\"]" << std::endl;
  buildFileContents << "    outputs: [\"" << outputFilePath << "\", \"" << depInfoFilePath << "\"]" << std::endl;
  buildFileContents << "    deps: \"" << depInfoFilePath << "\"" << std::endl;
  buildFileContents << "  \"<all>\":" << std::endl;
  buildFileContents << "    tool: phony" << std::endl;
  buildFileContents << "    inputs: [\"" << outputFilePath << "\"]" << std::endl;
  buildFileContents << "    outputs: [\"<all>\"]" << std::endl;
  writeFileContents(buildFilePath, buildFileContents.str());

  // Create an invocation.
  llb_buildsystem_invocation_t invocation = {};
  invocation.buildFilePath = buildFilePath.c_str();
  invocation.useSerialBuild = true;
  
  // Create a build system delegate.
  llb_buildsystem_delegate_t delegate = {};
  delegate.context = NULL;
  delegate.fs_get_file_contents = fs_get_file_contents;
  delegate.fs_get_file_info = fs_get_file_info;
  delegate.lookup_tool = lookup_tool;
  delegate.handle_diagnostic = handle_diagnostic;
  delegate.had_command_failure = had_command_failure;
  delegate.command_started = command_started;
  delegate.command_finished = command_finished;
  delegate.command_found_discovered_dependency = command_found_discovered_dependency;
  delegate.command_process_started = command_process_started;
  delegate.command_process_had_error = command_process_had_error;
  delegate.command_process_had_output = command_process_had_output;
  delegate.command_process_finished = command_process_finished;
  
  // Create a build system.
  llb_buildsystem_t* system = llb_buildsystem_create(delegate, invocation);
  
  // Initialize the system.
  llb_buildsystem_initialize(system);
  
  // Build the default target once.
  llb_data_t key = { 0, NULL };
  printf("initial build:\n");
  if (!llb_buildsystem_build(system, &key)) {
    printf("build had command failures\n");
  }
  
  // Check that the output file was produced and has the expected contents.
  std::string outputContentsFirstBuild = readFileContents(outputFilePath);
  EXPECT_EQ(outputContentsFirstBuild, "1");
  
  // Wait for at least a second because some filesystem only have file mod
  // times on the granularity of a second.
  // FIXME: might be better to just fake the timestamp on the file
  llbuild::basic::sys::sleep(1);

  // Change the contents of the indirect (not the direct) file.
  writeFileContents(indirectInputFilePath, "2");
  
  // Build the target again.
  printf("second build:\n");
  if (!llb_buildsystem_build(system, &key)) {
    printf("build had command failures\n");
  }
  
  // Check that the output file was updated and has the expected contents.
  std::string outputContentsSecondBuild = readFileContents(outputFilePath);
  EXPECT_EQ(outputContentsSecondBuild, "2");
  
  // Destroy the build system.
  llb_buildsystem_destroy(system);
}